

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O1

PromiseFromSignal<void_(Object::*)()>
QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
          (Object *fsender,offset_in_Object_to_subr fsignal,Object *rsender,
          offset_in_Object_to_subr rsignal)

{
  long *plVar1;
  undefined8 *puVar2;
  PromiseData<void> *extraout_RDX;
  PromiseData<void> *extraout_RDX_00;
  PromiseData<void> *extraout_RDX_01;
  PromiseData<void> *extraout_RDX_02;
  PromiseData<void> *extraout_RDX_03;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar3;
  PromiseFromSignal<void_(Object::*)()> PVar4;
  Object *in_stack_00000008;
  PromiseResolver<void> resolver;
  QPromiseConnections local_70;
  undefined1 local_60 [16];
  long *local_50;
  QPromiseConnections local_48;
  Object *local_38;
  
  *(undefined ***)fsender = &PTR__QPromiseBase_0012a6a0;
  local_38 = rsender;
  puVar2 = (undefined8 *)operator_new(0x58);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  *puVar2 = &PTR__PromiseDataBase_0012a7e0;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar2 + 2),0);
  *(undefined1 *)(puVar2 + 3) = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  *puVar2 = &PTR__PromiseDataBase_0012a768;
  *(undefined8 **)&fsender->field_0x8 = puVar2;
  LOCK();
  *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
  UNLOCK();
  local_50 = *(long **)&fsender->field_0x8;
  if (local_50 != (long *)0x0) {
    LOCK();
    *(int *)(local_50 + 1) = (int)local_50[1] + 1;
    UNLOCK();
  }
  local_60._8_8_ = &PTR__QPromiseBase_0012a730;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)
             &local_70.m_d.
              super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPromise<void> *)(local_60 + 8));
  local_60._8_8_ = &PTR__QPromiseBase_0012a6a0;
  if (local_50 != (long *)0x0) {
    LOCK();
    plVar1 = local_50 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if (((int)*plVar1 == 0) && (local_50 != (long *)0x0)) {
      (**(code **)(*local_50 + 8))();
    }
  }
  if (local_70.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)
              &(local_70.m_d.
                super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_70.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + 1;
    UNLOCK();
  }
  local_70.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_70.m_d.
           super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (local_70.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)
              &(local_70.m_d.
                super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_70.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + 1;
    UNLOCK();
  }
  local_60._0_8_ =
       local_70.m_d.
       super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012a808;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_48.m_d.
            super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_48.m_d.super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  QtPromisePrivate::connectSignalToResolver<Object,void(Object::*)()>
            ((QtPromisePrivate *)&local_48,&local_70,(QPromiseResolve<void> *)fsignal,
             (Object *)Object::noArgSignal,0);
  QtPromisePrivate::connectSignalToResolver<void,Object,void(Object::*)(int,QString_const&)>
            ((QtPromisePrivate *)&local_48,(QPromiseConnections *)local_60,
             (QPromiseReject<void> *)local_38,in_stack_00000008,
             (offset_in_Object_to_subr)resolver.m_d.d);
  QtPromisePrivate::connectDestroyedToReject<void,Object>
            (&local_48,(QPromiseReject<void> *)local_60,(Object *)fsignal);
  QVar3.d = extraout_RDX;
  if (local_48.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_d.
               super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    QVar3.d = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)local_60._0_8_)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)local_60._0_8_)->d).d + -1;
    UNLOCK();
    if ((*(int *)&(((QVector<QMetaObject::Connection> *)local_60._0_8_)->d).d == 0) &&
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      operator_delete((void *)local_60._0_8_,0x10);
      QVar3.d = extraout_RDX_01;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_70.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&((local_70.m_d.
               super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->connections).d.d =
         *(int *)&((local_70.m_d.
                    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->connections).d.d + -1;
    UNLOCK();
    if ((*(int *)&((local_70.m_d.
                    super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->connections).d.d == 0) &&
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_70.m_d.
        super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      operator_delete(local_70.m_d.
                      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0x10);
      QVar3.d = extraout_RDX_02;
    }
  }
  if (local_70.m_d.
      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    LOCK();
    *(int *)&(((QVector<QMetaObject::Connection> *)
              &(local_70.m_d.
                super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d =
         *(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_70.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d + -1;
    UNLOCK();
    if ((*(int *)&(((QVector<QMetaObject::Connection> *)
                   &(local_70.m_d.
                     super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_vptr__Sp_counted_base)->d).d == 0) &&
       (local_70.m_d.
        super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      operator_delete(local_70.m_d.
                      super___shared_ptr<QtPromise::QPromiseConnections::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,0x10);
      QVar3.d = extraout_RDX_03;
    }
  }
  *(undefined ***)fsender = &PTR__QPromiseBase_0012a730;
  PVar4.super_QPromiseBase<void>.m_d.d = QVar3.d;
  PVar4.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)fsender;
  return (PromiseFromSignal<void_(Object::*)()>)PVar4.super_QPromiseBase<void>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseFromSignal<FSignal>
connect(const FSender* fsender, FSignal fsignal, const RSender* rsender, RSignal rsignal)
{
    using namespace QtPromisePrivate;
    using T = typename PromiseFromSignal<FSignal>::Type;

    return QPromise<T>{[&](const QPromiseResolve<T>& resolve, const QPromiseReject<T>& reject) {
        QPromiseConnections connections;
        connectSignalToResolver(connections, resolve, fsender, fsignal);
        connectSignalToResolver(connections, reject, rsender, rsignal);
        connectDestroyedToReject(connections, reject, fsender);
    }};
}